

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O0

Abc_Obj_t *
Abc_NodeBddToMuxes_rec(DdManager *dd,DdNode *bFunc,Abc_Ntk_t *pNtkNew,st__table *tBdd2Node)

{
  Abc_Obj_t *table;
  int iVar1;
  DdNode *key;
  Abc_Obj_t *local_50;
  Abc_Obj_t *pNodeNewC;
  Abc_Obj_t *pNodeNew1;
  Abc_Obj_t *pNodeNew0;
  Abc_Obj_t *pNodeNew;
  st__table *tBdd2Node_local;
  Abc_Ntk_t *pNtkNew_local;
  DdNode *bFunc_local;
  DdManager *dd_local;
  
  pNodeNew = (Abc_Obj_t *)tBdd2Node;
  tBdd2Node_local = (st__table *)pNtkNew;
  pNtkNew_local = (Abc_Ntk_t *)bFunc;
  bFunc_local = &dd->sentinel;
  if (((ulong)bFunc & 1) != 0) {
    __assert_fail("!Cudd_IsComplement(bFunc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcNtbdd.c"
                  ,0xe3,
                  "Abc_Obj_t *Abc_NodeBddToMuxes_rec(DdManager *, DdNode *, Abc_Ntk_t *, st__table *)"
                 );
  }
  if (bFunc == dd->one) {
    dd_local = (DdManager *)Abc_NtkCreateNodeConst1(pNtkNew);
  }
  else {
    iVar1 = st__lookup(tBdd2Node,(char *)bFunc,(char **)&pNodeNew0);
    if (iVar1 == 0) {
      pNodeNew1 = Abc_NodeBddToMuxes_rec
                            ((DdManager *)bFunc_local,
                             (DdNode *)((ulong)pNtkNew_local->pManName & 0xfffffffffffffffe),
                             (Abc_Ntk_t *)tBdd2Node_local,(st__table *)pNodeNew);
      if (((ulong)pNtkNew_local->pManName & 1) != 0) {
        pNodeNew1 = Abc_NtkCreateNodeInv((Abc_Ntk_t *)tBdd2Node_local,pNodeNew1);
      }
      pNodeNewC = Abc_NodeBddToMuxes_rec
                            ((DdManager *)bFunc_local,(DdNode *)pNtkNew_local->pSpec,
                             (Abc_Ntk_t *)tBdd2Node_local,(st__table *)pNodeNew);
      table = pNodeNew;
      key = Cudd_bddIthVar((DdManager *)bFunc_local,pNtkNew_local->ntkType);
      iVar1 = st__lookup((st__table *)table,(char *)key,(char **)&local_50);
      if (iVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcNtbdd.c"
                      ,0xee,
                      "Abc_Obj_t *Abc_NodeBddToMuxes_rec(DdManager *, DdNode *, Abc_Ntk_t *, st__table *)"
                     );
      }
      pNodeNew0 = Abc_NtkCreateNodeMux((Abc_Ntk_t *)tBdd2Node_local,local_50,pNodeNewC,pNodeNew1);
      st__insert((st__table *)pNodeNew,(char *)pNtkNew_local,(char *)pNodeNew0);
      dd_local = (DdManager *)pNodeNew0;
    }
    else {
      dd_local = (DdManager *)pNodeNew0;
    }
  }
  return (Abc_Obj_t *)dd_local;
}

Assistant:

Abc_Obj_t * Abc_NodeBddToMuxes_rec( DdManager * dd, DdNode * bFunc, Abc_Ntk_t * pNtkNew, st__table * tBdd2Node )
{
    Abc_Obj_t * pNodeNew, * pNodeNew0, * pNodeNew1, * pNodeNewC;
    assert( !Cudd_IsComplement(bFunc) );
    if ( bFunc == b1 )
        return Abc_NtkCreateNodeConst1(pNtkNew);
    if ( st__lookup( tBdd2Node, (char *)bFunc, (char **)&pNodeNew ) )
        return pNodeNew;
    // solve for the children nodes
    pNodeNew0 = Abc_NodeBddToMuxes_rec( dd, Cudd_Regular(cuddE(bFunc)), pNtkNew, tBdd2Node );
    if ( Cudd_IsComplement(cuddE(bFunc)) )
        pNodeNew0 = Abc_NtkCreateNodeInv( pNtkNew, pNodeNew0 );
    pNodeNew1 = Abc_NodeBddToMuxes_rec( dd, cuddT(bFunc), pNtkNew, tBdd2Node );
    if ( ! st__lookup( tBdd2Node, (char *)Cudd_bddIthVar(dd, bFunc->index), (char **)&pNodeNewC ) )
        assert( 0 );
    // create the MUX node
    pNodeNew = Abc_NtkCreateNodeMux( pNtkNew, pNodeNewC, pNodeNew1, pNodeNew0 );
    st__insert( tBdd2Node, (char *)bFunc, (char *)pNodeNew );
    return pNodeNew;
}